

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 SyByteFind(char *zStr,sxu32 nLen,sxi32 c,sxu32 *pPos)

{
  char *pcVar1;
  char *zIn;
  char *pcVar2;
  char *pcVar3;
  
  pcVar1 = zStr + nLen;
  pcVar2 = zStr + 3;
  while( true ) {
    pcVar3 = pcVar2 + -3;
    if (pcVar1 <= pcVar3) {
      return -6;
    }
    if (*pcVar3 == c) break;
    pcVar3 = pcVar2 + -2;
    if (pcVar1 <= pcVar3) {
      return -6;
    }
    if (*pcVar3 == c) break;
    pcVar3 = pcVar2 + -1;
    if (pcVar1 <= pcVar3) {
      return -6;
    }
    if (*pcVar3 == c) break;
    if (pcVar1 <= pcVar2) {
      return -6;
    }
    pcVar3 = pcVar2;
    if (*pcVar2 == c) break;
    pcVar2 = pcVar2 + 4;
  }
  if (pPos != (sxu32 *)0x0) {
    *pPos = (int)pcVar3 - (int)zStr;
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 SyByteFind(const char *zStr, sxu32 nLen, sxi32 c, sxu32 *pPos)
{
	const char *zIn = zStr;
	const char *zEnd;
	
	zEnd = &zIn[nLen];
	for(;;){
		if( zIn >= zEnd ){ break; }if( zIn[0] == c ){ if( pPos ){ *pPos = (sxu32)(zIn - zStr); } return SXRET_OK; } zIn++;
		if( zIn >= zEnd ){ break; }if( zIn[0] == c ){ if( pPos ){ *pPos = (sxu32)(zIn - zStr); } return SXRET_OK; } zIn++;
		if( zIn >= zEnd ){ break; }if( zIn[0] == c ){ if( pPos ){ *pPos = (sxu32)(zIn - zStr); } return SXRET_OK; } zIn++;
		if( zIn >= zEnd ){ break; }if( zIn[0] == c ){ if( pPos ){ *pPos = (sxu32)(zIn - zStr); } return SXRET_OK; } zIn++;
	}
	return SXERR_NOTFOUND;
}